

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_light.cpp
# Opt level: O2

bool __thiscall ON_Light::IsDirectionalLight(ON_Light *this)

{
  return this->m_style == world_directional_light || this->m_style == camera_directional_light;
}

Assistant:

const bool ON_Light::IsDirectionalLight() const
{
  bool rc;
  switch(m_style)
  {
  //case ON::view_directional_light:
  case ON::camera_directional_light:
  case ON::world_directional_light:
    rc = true;
    break;
  default:
    rc = false;
    break;
  }
  return rc;
}